

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

MemOp gen_pop_T0(DisasContext *s)

{
  TCGContext *pTVar1;
  MemOp idx;
  MemOp aflag;
  MemOp d_ot;
  TCGContext *tcg_ctx;
  DisasContext *s_local;
  
  pTVar1 = s->uc->tcg_ctx;
  idx = mo_pushpop(s,s->dflag);
  aflag = mo_stacksize(s);
  gen_lea_v_seg(s,aflag,pTVar1->cpu_regs[4],2,-1);
  gen_op_ld_v(s,idx,s->T0,s->A0);
  return idx;
}

Assistant:

static MemOp gen_pop_T0(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    MemOp d_ot = mo_pushpop(s, s->dflag);

    gen_lea_v_seg(s, mo_stacksize(s), tcg_ctx->cpu_regs[R_ESP], R_SS, -1);
    gen_op_ld_v(s, d_ot, s->T0, s->A0);

    return d_ot;
}